

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

FIELD * Sorted_Previous_Field(FIELD *field)

{
  FIELD *local_18;
  FIELD *field_on_page;
  FIELD *field_local;
  
  local_18 = field;
  do {
    local_18 = local_18->sprev;
    if ((local_18->opts & 3U) == 3) {
      return local_18;
    }
  } while (local_18 != field);
  return local_18;
}

Assistant:

INLINE static FIELD *Sorted_Previous_Field(FIELD * field)
{
  FIELD *field_on_page = field;

  do
    {
      field_on_page = field_on_page->sprev;
      if (Field_Is_Selectable(field_on_page))
        break;
    } while(field_on_page!=field);
  
  return (field_on_page);
}